

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

Maybe<kj::Promise<kj::Own<capnp::ClientHook>_>_> * __thiscall
capnp::anon_unknown_0::BrokenClient::whenMoreResolved
          (Maybe<kj::Promise<kj::Own<capnp::ClientHook>_>_> *__return_storage_ptr__,
          BrokenClient *this)

{
  Exception local_180;
  Promise<kj::Own<capnp::ClientHook>_> local_28;
  BrokenClient *local_18;
  BrokenClient *this_local;
  
  local_18 = this;
  this_local = (BrokenClient *)__return_storage_ptr__;
  if ((this->resolved & 1U) == 0) {
    kj::cp<kj::Exception>(&local_180,&this->exception);
    kj::Promise<kj::Own<capnp::ClientHook>_>::Promise(&local_28,&local_180);
    kj::Maybe<kj::Promise<kj::Own<capnp::ClientHook>_>_>::Maybe(__return_storage_ptr__,&local_28);
    kj::Promise<kj::Own<capnp::ClientHook>_>::~Promise(&local_28);
    kj::Exception::~Exception(&local_180);
  }
  else {
    kj::Maybe<kj::Promise<kj::Own<capnp::ClientHook>_>_>::Maybe(__return_storage_ptr__,(void *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::Promise<kj::Own<ClientHook>>> whenMoreResolved() override {
    if (resolved) {
      return nullptr;
    } else {
      return kj::Promise<kj::Own<ClientHook>>(kj::cp(exception));
    }
  }